

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_report.cpp
# Opt level: O0

void __thiscall
sc_core::sc_report::sc_report
          (sc_report *this,sc_severity severity_,sc_msg_def *md_,char *msg_,char *file_,int line_,
          int verbosity_level)

{
  char *pcVar1;
  sc_time *this_00;
  sc_time *t;
  undefined8 in_RDX;
  undefined4 in_ESI;
  exception *in_RDI;
  undefined4 in_R9D;
  undefined4 in_stack_00000008;
  sc_report *in_stack_00000048;
  char *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  string local_60 [52];
  undefined4 local_2c;
  undefined8 local_18;
  undefined4 local_c;
  
  local_2c = in_R9D;
  local_18 = in_RDX;
  local_c = in_ESI;
  std::exception::exception(in_RDI);
  *(undefined ***)in_RDI = &PTR__sc_report_00366e00;
  *(undefined4 *)(in_RDI + 8) = local_c;
  *(undefined8 *)(in_RDI + 0x10) = local_18;
  pcVar1 = empty_dup(in_stack_ffffffffffffff38);
  *(char **)(in_RDI + 0x18) = pcVar1;
  pcVar1 = empty_dup(in_stack_ffffffffffffff38);
  *(char **)(in_RDI + 0x20) = pcVar1;
  *(undefined4 *)(in_RDI + 0x28) = local_2c;
  this_00 = (sc_time *)operator_new(8);
  t = sc_time_stamp();
  sc_time::sc_time(this_00,t);
  *(sc_time **)(in_RDI + 0x30) = this_00;
  sc_get_current_process_name(in_stack_ffffffffffffff30);
  pcVar1 = empty_dup(in_stack_ffffffffffffff38);
  *(char **)(in_RDI + 0x38) = pcVar1;
  *(undefined4 *)(in_RDI + 0x40) = in_stack_00000008;
  sc_report_compose_message_abi_cxx11_(in_stack_00000048);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  pcVar1 = empty_dup(pcVar1);
  std::__cxx11::string::~string(local_60);
  *(char **)(in_RDI + 0x48) = pcVar1;
  return;
}

Assistant:

sc_report::sc_report(sc_severity severity_,
		     const sc_msg_def* md_,
		     const char* msg_,
		     const char* file_,
		     int line_,
		     int verbosity_level)
: severity(severity_),
  md(md_),
  msg(empty_dup(msg_)),
  file(empty_dup(file_)),
  line(line_),
  timestamp(new sc_time(sc_time_stamp())),
  process_name(empty_dup(sc_get_current_process_name())),
  m_verbosity_level(verbosity_level),
  m_what( empty_dup( sc_report_compose_message(*this).c_str() ) )
{
}